

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  char_t *end;
  byte *pbVar1;
  byte bVar2;
  char_t *begin;
  
  do {
    do {
      pbVar1 = (byte *)s;
      bVar2 = *pbVar1;
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) goto LAB_0012937c;
      bVar2 = pbVar1[1];
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
        pbVar1 = pbVar1 + 1;
        goto LAB_0012937c;
      }
      bVar2 = pbVar1[2];
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
        pbVar1 = pbVar1 + 2;
        goto LAB_0012937c;
      }
      bVar2 = pbVar1[3];
      s = (char_t *)(pbVar1 + 4);
    } while (((anonymous_namespace)::chartype_table[bVar2] & 1) == 0);
    pbVar1 = pbVar1 + 3;
LAB_0012937c:
    if (bVar2 == 0) {
      *pbVar1 = 0;
      return (char_t *)pbVar1;
    }
    if (bVar2 == 0x3c) {
      *pbVar1 = 0;
      return (char_t *)(pbVar1 + 1);
    }
    s = (char_t *)(pbVar1 + 1);
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}